

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

P_Sequence * parse(s_i *prog)

{
  undefined1 uVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  DType DVar8;
  DType DVar9;
  uint uVar10;
  int iVar11;
  Token *pTVar12;
  _func_int **pp_Var13;
  pointer pDVar14;
  long lVar15;
  Pattern *pPVar16;
  undefined1 *puVar17;
  long lVar18;
  Pattern *pPVar19;
  Pattern *pPVar20;
  P_Sequence *pPVar21;
  undefined8 *puVar22;
  undefined **ppuVar23;
  char cVar24;
  iterator iVar25;
  pointer ppTVar26;
  pointer pDVar27;
  iterator iVar28;
  Token **ppTVar29;
  vector<Token_*,_std::allocator<Token_*>_> tokens0;
  Token *tok;
  vector<Token_*,_std::allocator<Token_*>_> tokens1;
  Token *tok_2;
  vector<Token_*,_std::allocator<Token_*>_> local_e8;
  vector<Direction,_std::allocator<Direction>_> local_c8;
  uint local_ac;
  Token *local_a8;
  iterator iStack_a0;
  Pattern **local_98;
  Token **local_88;
  iterator iStack_80;
  Token **local_78;
  Token *local_70;
  Pattern *local_68 [2];
  Token **local_58;
  Token **local_50;
  vector<Token_*,_std::allocator<Token_*>_> local_48;
  
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Token **)0x0;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Token **)0x0;
switchD_0010a67f_caseD_9:
  iVar7 = s_i::get(prog);
  switch(iVar7) {
  case 0x5c:
    pDVar14 = (pointer)operator_new(0x10);
    puVar22 = (undefined8 *)operator_new(0x10);
    iVar7 = s_i::get(prog);
    *puVar22 = &PTR__Pattern_00113890;
    *(int *)(puVar22 + 1) = iVar7;
    *(undefined ***)pDVar14 = &PTR__Token_001137b0;
    *(undefined8 **)(pDVar14->x + 1) = puVar22;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = pDVar14;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) break;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a67f_caseD_9;
  case 0x5d:
  case 0x5f:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x76:
  case 0x78:
    goto switchD_0010a643_caseD_5d;
  case 0x5e:
    pDVar14 = (pointer)operator_new(0x10);
    puVar22 = (undefined8 *)operator_new(0x10);
    iVar7 = s_i::get(prog);
    *puVar22 = &PTR__Pattern_001138e0;
    *(int *)(puVar22 + 1) = iVar7;
    *(undefined ***)pDVar14 = &PTR__Token_001137b0;
    *(undefined8 **)(pDVar14->x + 1) = puVar22;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = pDVar14;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x60:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113ad8;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a7d8;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a67f_caseD_9;
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x72:
  case 0x73:
  case 0x75:
  case 0x77:
  case 0x79:
  case 0x7a:
    if (prog->utf8 == true) {
      prog->i = prog->i + -1;
    }
    else {
      prog->i = prog->i + -1;
    }
    pTVar12 = (Token *)operator_new(0x10);
    pp_Var13 = (_func_int **)operator_new(0x20);
    read_dirs(&local_c8,prog,true);
    *pp_Var13 = (_func_int *)&PTR__DirectionAlternation_00113750;
    std::vector<Direction,_std::allocator<Direction>_>::vector
              ((vector<Direction,_std::allocator<Direction>_> *)(pp_Var13 + 1),&local_c8);
    pTVar12->_vptr_Token = (_func_int **)&PTR__Token_001137b0;
    pTVar12[1]._vptr_Token = pp_Var13;
    local_a8 = pTVar12;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_a8);
    }
    else {
      *local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
       super__Vector_impl_data._M_finish = pTVar12;
      local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
    }
    if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    goto switchD_0010a67f_caseD_9;
  case 0x74:
    pDVar14 = (pointer)operator_new(0x10);
    puVar22 = (undefined8 *)operator_new(8);
    *puVar22 = &PTR__Pattern_00113bb8;
    *(undefined ***)pDVar14 = &PTR__Token_001137b0;
    *(undefined8 **)(pDVar14->x + 1) = puVar22;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = pDVar14;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x7b:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_001139f8;
    (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start)->x[1] = 2;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a7d8;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a67f_caseD_9;
  case 0x7c:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113988;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a7d8;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a67f_caseD_9;
  case 0x7d:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113a68;
    (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start)->x[1] = 2;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0010a7d8;
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_e8,
               (iterator)
               local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(Token **)&local_c8);
    goto switchD_0010a67f_caseD_9;
  case 0x7e:
    pDVar14 = (pointer)operator_new(0x10);
    puVar22 = (undefined8 *)operator_new(8);
    *puVar22 = &PTR__Pattern_00113950;
    *(undefined ***)pDVar14 = &PTR__Token_001137b0;
    *(undefined8 **)(pDVar14->x + 1) = puVar22;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = pDVar14;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  default:
    goto code_r0x0010a671;
  }
LAB_0010ab99:
  *local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
   _M_finish = (Token *)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                        super__Vector_impl_data._M_start;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
  goto switchD_0010a67f_caseD_9;
code_r0x0010a671:
  switch(iVar7) {
  case 9:
  case 10:
  case 0xd:
  case 0x20:
    goto switchD_0010a67f_caseD_9;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2a:
  case 0x2d:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3e:
    goto switchD_0010a643_caseD_5d;
  case 0x21:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113b48;
    *(undefined1 *)
     ((local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
       super__Vector_impl_data._M_start)->x + 1) = 0;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start[1].x[0] = 0;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start[1].x[1] = 0;
    *(_func_int ***)
     (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start + 2) = (_func_int **)0x0;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x28:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_001139f8;
    (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start)->x[1] = 1;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x29:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113a68;
    (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start)->x[1] = 1;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x2b:
    iVar7 = s_i::peek(prog,0);
    if (iVar7 == 0x3f) {
      s_i::get(prog);
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
      *(undefined ***)
       local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
       super__Vector_impl_data._M_start = &PTR__Token_00113820;
      *(undefined8 *)
       ((local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_start)->x + 1) = 0x1ffffffff;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a67f_caseD_9;
      }
    }
    else {
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
      *(undefined ***)
       local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
       super__Vector_impl_data._M_start = &PTR__Token_00113820;
      *(undefined8 *)
       ((local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_start)->x + 1) = 0xffffffff00000001;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a67f_caseD_9;
      }
    }
    break;
  case 0x2c:
    iVar7 = s_i::peek(prog,0);
    if (iVar7 == 0x2c) {
      do {
        iVar7 = s_i::get(prog);
        if (iVar7 == -1) break;
      } while (iVar7 != 10);
      goto switchD_0010a67f_caseD_9;
    }
    iVar7 = s_i::peek(prog,0);
    DVar9 = ~ABSOLUTE;
    if (iVar7 - 0x30U < 10) {
      DVar9 = read_num(prog);
    }
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113820;
    (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start)->x[1] = 0;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start[1].type = DVar9;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x2e:
    pDVar14 = (pointer)operator_new(0x10);
    puVar22 = (undefined8 *)operator_new(8);
    *puVar22 = &PTR__Pattern_00113918;
    *(undefined ***)pDVar14 = &PTR__Token_001137b0;
    *(undefined8 **)(pDVar14->x + 1) = puVar22;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = pDVar14;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    goto LAB_0010ab99;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    if (prog->utf8 == true) {
      prog->i = prog->i + -1;
    }
    else {
      prog->i = prog->i + -1;
    }
    DVar8 = read_num(prog);
    iVar7 = s_i::peek(prog,0);
    DVar9 = DVar8;
    if ((iVar7 == 0x2c) && (iVar7 = s_i::peek(prog,1), iVar7 != 0x2c)) {
      s_i::get(prog);
      iVar7 = s_i::peek(prog,0);
      DVar9 = ~ABSOLUTE;
      if (iVar7 - 0x30U < 10) {
        DVar9 = read_num(prog);
      }
    }
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113820;
    (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start)->x[1] = DVar8;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start[1].type = DVar9;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x3d:
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    *(undefined ***)
     local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
     super__Vector_impl_data._M_start = &PTR__Token_00113b48;
    *(undefined1 *)
     ((local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
       super__Vector_impl_data._M_start)->x + 1) = 1;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start[1].x[0] = 0;
    local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
    super__Vector_impl_data._M_start[1].x[1] = 0;
    *(_func_int ***)
     (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start + 2) = (_func_int **)0x0;
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Token **)&local_c8);
      goto switchD_0010a67f_caseD_9;
    }
    break;
  case 0x3f:
    iVar7 = s_i::peek(prog,0);
    if (iVar7 == 0x3f) {
      s_i::get(prog);
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
      *(undefined ***)
       local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
       super__Vector_impl_data._M_start = &PTR__Token_00113820;
      *(undefined8 *)
       ((local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_start)->x + 1) = 1;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a67f_caseD_9;
      }
    }
    else {
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
      *(undefined ***)
       local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
       super__Vector_impl_data._M_start = &PTR__Token_00113820;
      *(undefined8 *)
       ((local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_start)->x + 1) = 0x100000000;
      if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)&local_c8);
        goto switchD_0010a67f_caseD_9;
      }
    }
    break;
  default:
    if (iVar7 == -1) {
      std::vector<Token_*,_std::allocator<Token_*>_>::vector(&local_48,&local_e8);
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0010af45;
      pPVar16 = (Pattern *)0x0;
      ppTVar26 = local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      goto LAB_0010ade8;
    }
    goto switchD_0010a643_caseD_5d;
  }
LAB_0010a7d8:
  *local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
   _M_finish = (Token *)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                        super__Vector_impl_data._M_start;
  local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
  goto switchD_0010a67f_caseD_9;
switchD_0010a643_caseD_5d:
  puVar22 = (undefined8 *)__cxa_allocate_exception(0x18);
  iVar7 = *(int *)&prog->i;
  iVar11 = *(int *)&(prog->s->_M_dataplus)._M_p;
  *puVar22 = &PTR__exception_001136c0;
  puVar22[1] = "Unrecognized instruction";
  *(int *)(puVar22 + 2) = iVar7 - iVar11;
  __cxa_throw(puVar22,&parse_exc::typeinfo,std::exception::~exception);
LAB_0010ade8:
  do {
    local_a8 = *ppTVar26;
    if (local_a8 == (Token *)0x0) {
      lVar15 = 0;
    }
    else {
      lVar15 = __dynamic_cast(local_a8,&Token::typeinfo,&T_Assert::typeinfo,0);
    }
    if (lVar15 != 0) {
      pPVar16 = (Pattern *)operator_new(0x20);
      uVar1 = *(undefined1 *)(lVar15 + 8);
      pPVar16->_vptr_Pattern = (_func_int **)&PTR__Token_00113b48;
      *(undefined1 *)&pPVar16[1]._vptr_Pattern = uVar1;
      pPVar16[2]._vptr_Pattern = (_func_int **)0x0;
      pPVar16[3]._vptr_Pattern = (_func_int **)0x0;
      local_68[0] = pPVar16;
      if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                  ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                   super__Vector_impl_data._M_finish,(Token **)local_68);
      }
      else {
        *(Pattern **)
         local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_finish = pPVar16;
        local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 8);
      }
    }
    if (lVar15 != 0) goto LAB_0010aeda;
    if (pPVar16 == (Pattern *)0x0) {
LAB_0010aeac:
      if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                  ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a8);
      }
      else {
        *(Token **)
         local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
         super__Vector_impl_data._M_finish = local_a8;
        local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 8);
      }
      pPVar16 = (Pattern *)0x0;
    }
    else {
      if (local_a8 == (Token *)0x0) {
        lVar15 = 0;
      }
      else {
        lVar15 = __dynamic_cast(local_a8,&Token::typeinfo,&T_Pattern::typeinfo,0);
      }
      if (lVar15 == 0) goto LAB_0010aeac;
      if (((pPVar16[2]._vptr_Pattern == (_func_int **)0x0) &&
          (pp_Var13 = *(_func_int ***)(lVar15 + 8), pp_Var13 != (_func_int **)0x0)) &&
         (lVar18 = __dynamic_cast(pp_Var13,&AST::Pattern::typeinfo,&AST::Teleport::typeinfo,0),
         lVar18 != 0)) {
        pPVar16[2]._vptr_Pattern = pp_Var13;
      }
      else {
        if (((pPVar16[3]._vptr_Pattern != (_func_int **)0x0) ||
            (pp_Var13 = *(_func_int ***)(lVar15 + 8), pp_Var13 == (_func_int **)0x0)) ||
           (lVar15 = __dynamic_cast(pp_Var13,&AST::Pattern::typeinfo,
                                    &AST::DirectionAlternation::typeinfo,0), lVar15 == 0))
        goto LAB_0010aeac;
        pPVar16[3]._vptr_Pattern = pp_Var13;
      }
    }
LAB_0010aeda:
    ppTVar26 = ppTVar26 + 1;
  } while (ppTVar26 !=
           local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
           super__Vector_impl_data._M_finish);
LAB_0010af45:
  local_88 = (Token **)0x0;
  iStack_80._M_current = (Token **)0x0;
  local_78 = (Token **)0x0;
  if (insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat == '\0') {
    parse();
  }
  if ((insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty == '\0') &&
     (iVar7 = __cxa_guard_acquire(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                                   ::empty), iVar7 != 0)) {
    insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._8_8_ =
         operator_new(8);
    *(undefined ***)
     insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._8_8_ =
         &PTR__Pattern_00113c60;
    insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty._0_8_ =
         &PTR__Token_001137b0;
    __cxa_guard_release(&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                         empty);
  }
  local_a8 = (Token *)operator_new(0x10);
  local_a8->_vptr_Token = (_func_int **)&PTR__Token_001139f8;
  *(undefined4 *)&local_a8[1]._vptr_Token = 0;
  if (iStack_80._M_current == local_78) {
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
  }
  else {
    *iStack_80._M_current = local_a8;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
  pDVar14 = local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar6 = true;
  uVar10 = 0;
  cVar24 = '\0';
  if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = (Token **)0x10f47c;
    pDVar27 = local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_a8 = *(Token **)pDVar27;
      iVar7 = (*local_a8->_vptr_Token[4])();
      if (((char)iVar7 == '\0') && (iVar7 = (*local_a8->_vptr_Token[2])(), (char)iVar7 == '\0')) {
        iVar7 = (*local_a8->_vptr_Token[6])();
        pTVar12 = local_a8;
        if ((char)iVar7 == '\0') {
          if ((uVar10 & 1) != 0) {
LAB_0010b9b0:
            puVar22 = (undefined8 *)__cxa_allocate_exception(0x18);
            *puVar22 = &PTR__exception_001136c0;
            puVar22[1] = local_58;
            *(undefined4 *)(puVar22 + 2) = 0xffffffff;
            __cxa_throw(puVar22,&parse_exc::typeinfo,std::exception::~exception);
          }
          if ((local_a8 == (Token *)0x0) ||
             (lVar15 = __dynamic_cast(local_a8,&Token::typeinfo,&T_Alternator::typeinfo,0),
             lVar15 == 0)) {
            iVar7 = (*pTVar12->_vptr_Token[5])(pTVar12);
            if ((char)iVar7 == '\0') {
              iVar7 = (*local_a8->_vptr_Token[7])();
              if ((char)iVar7 == '\0') {
                __assert_fail("tok->isGroupCloser()",
                              "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                              ,0x125,"vector<Token *> insert_concatenators(const vector<Token *> &)"
                             );
              }
              if (bVar6) {
                local_68[0] = (Pattern *)
                              insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                              ::empty;
                if (iStack_80._M_current == local_78) {
                  std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                            ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                             (Token **)local_68);
                }
                else {
                  *iStack_80._M_current =
                       (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)
                                ::empty;
                  iStack_80._M_current = iStack_80._M_current + 1;
                }
              }
              goto LAB_0010b01b;
            }
            if (bVar6) {
              local_58 = (Token **)0x10f48e;
              goto LAB_0010b9b0;
            }
            goto LAB_0010b18f;
          }
          if (bVar6) {
            puVar17 = insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
            local_68[0] = (Pattern *)
                          insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                          empty;
            if (iStack_80._M_current != local_78) goto LAB_0010b0fd;
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                       (Token **)local_68);
          }
        }
        else if (((uVar10 & 1) == 0) && (!bVar6)) {
          puVar17 = (undefined1 *)
                    &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat;
          local_68[0] = (Pattern *)
                        &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat
          ;
          if (iStack_80._M_current == local_78) {
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                       (Token **)local_68);
          }
          else {
LAB_0010b0fd:
            *iStack_80._M_current = (Token *)puVar17;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
        bVar6 = true;
      }
      else if ((uVar10 & 1) == 0) {
        if (bVar6) {
LAB_0010b01b:
          bVar6 = false;
        }
        else {
          local_68[0] = (Pattern *)
                        &insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::cat
          ;
          if (iStack_80._M_current == local_78) {
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                      ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,
                       (Token **)local_68);
          }
          else {
            *iStack_80._M_current =
                 (Token *)&insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                           cat;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
        }
      }
LAB_0010b18f:
      if (iStack_80._M_current == local_78) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                  ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
      }
      else {
        *iStack_80._M_current = local_a8;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      uVar10 = (*local_a8->_vptr_Token[4])();
      cVar24 = (char)uVar10;
      pDVar27 = (pointer)(pDVar27->x + 1);
    } while (pDVar27 != pDVar14);
  }
  if (cVar24 != '\0') {
    puVar22 = (undefined8 *)__cxa_allocate_exception(0x18);
    *puVar22 = &PTR__exception_001136c0;
    puVar22[1] = "Nothing to assert";
    *(undefined4 *)(puVar22 + 2) = 0xffffffff;
    __cxa_throw(puVar22,&parse_exc::typeinfo,std::exception::~exception);
  }
  if (bVar6) {
    local_a8 = (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::
                        empty;
    if (iStack_80._M_current == local_78) {
      std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
                ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
    }
    else {
      *iStack_80._M_current =
           (Token *)insert_concatenators(std::vector<Token*,std::allocator<Token*>>const&)::empty;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
  }
  local_a8 = (Token *)operator_new(0x10);
  local_a8->_vptr_Token = (_func_int **)&PTR__Token_00113a68;
  *(undefined4 *)&local_a8[1]._vptr_Token = 0;
  if (iStack_80._M_current == local_78) {
    std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*>
              ((vector<Token*,std::allocator<Token*>> *)&local_88,iStack_80,&local_a8);
  }
  else {
    *iStack_80._M_current = local_a8;
    iStack_80._M_current = iStack_80._M_current + 1;
  }
  if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_98 = (Pattern **)0x0;
  local_a8 = (Token *)0x0;
  iStack_a0._M_current = (Pattern **)0x0;
  if (local_88 != iStack_80._M_current) {
    local_ac = 1;
    local_50 = iStack_80._M_current;
    iVar28._M_current = iStack_80._M_current;
    ppTVar29 = local_88;
    do {
      local_70 = *ppTVar29;
      iVar7 = (*local_70->_vptr_Token[5])();
      pTVar12 = local_70;
      if ((char)iVar7 == '\0') {
        iVar7 = (*local_70->_vptr_Token[4])(local_70);
        if (((char)iVar7 == '\0') && (iVar7 = (*local_70->_vptr_Token[6])(), (char)iVar7 == '\0')) {
          iVar7 = (*local_70->_vptr_Token[2])();
          if ((char)iVar7 == '\0') {
            local_58 = ppTVar29;
            if ((local_ac & 1) != 0) {
              __assert_fail("!expectAtom",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x15c,"AST::Pattern *parse_tokenized(vector<Token *> &)");
            }
LAB_0010b40a:
            pTVar12 = local_70;
            plVar3 = *(long **)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                               _M_impl.super__Vector_impl_data._M_finish[-1].x;
            iVar7 = (*local_70->_vptr_Token[8])(local_70);
            iVar11 = (**(code **)(*plVar3 + 0x40))(plVar3);
            if (iVar7 <= iVar11) {
LAB_0010b484:
              plVar3 = *(long **)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                                 _M_impl.super__Vector_impl_data._M_finish[-1].x;
              local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].x;
              iVar7 = (**(code **)(*plVar3 + 0x20))(plVar3);
              if ((char)iVar7 == '\0') {
                iVar7 = (**(code **)(*plVar3 + 0x18))(plVar3);
                if ((char)iVar7 != '\0') {
                  lVar15 = __dynamic_cast(plVar3,&Token::typeinfo,&T_Concatenation::typeinfo,0);
                  if (lVar15 == 0) {
                    lVar15 = __dynamic_cast(plVar3,&Token::typeinfo,&T_Alternator::typeinfo,0);
                    if (lVar15 == 0) {
                      __assert_fail("isA<T_Alternator>(op)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                                    ,0x174,"AST::Pattern *parse_tokenized(vector<Token *> &)");
                    }
                    local_68[0] = (Pattern *)operator_new(0x18);
                    ppuVar23 = &PTR__Pattern_00113d70;
                  }
                  else {
                    local_68[0] = (Pattern *)operator_new(0x18);
                    ppuVar23 = &PTR__Pattern_00113d20;
                  }
                  local_68[0]->_vptr_Pattern = (_func_int **)ppuVar23;
                  local_68[0][2]._vptr_Pattern = (_func_int **)iStack_a0._M_current[-1];
                  iVar25._M_current = iStack_a0._M_current + -2;
                  local_68[0][1]._vptr_Pattern = (_func_int **)iStack_a0._M_current[-2];
                  if (iVar25._M_current == local_98) {
                    iStack_a0._M_current = iVar25._M_current;
                    std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
                    _M_realloc_insert<AST::Pattern*>
                              ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,
                               iVar25,local_68);
                  }
                  else {
                    *iVar25._M_current = local_68[0];
                    iStack_a0._M_current = iStack_a0._M_current + -1;
                  }
                }
              }
              else {
                lVar15 = __dynamic_cast(plVar3,&Token::typeinfo,&T_Assert::typeinfo,0);
                if (lVar15 == 0) {
                  __assert_fail("ta",
                                "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                                ,0x161,"AST::Pattern *parse_tokenized(vector<Token *> &)");
                }
                pPVar19 = (Pattern *)operator_new(0x18);
                pPVar19->_vptr_Pattern = (_func_int **)&PTR__Pattern_00113ce8;
                *(undefined1 *)&pPVar19[2]._vptr_Pattern = *(undefined1 *)(lVar15 + 8);
                iVar25._M_current = iStack_a0._M_current + -1;
                local_68[0] = *(Pattern **)(lVar15 + 0x18);
                local_68[1] = (Pattern *)*(undefined8 *)(lVar15 + 0x10);
                lVar15 = 0;
                pPVar16 = iStack_a0._M_current[-1];
                iStack_a0._M_current = iVar25._M_current;
                do {
                  pp_Var13 = *(_func_int ***)((long)local_68 + lVar15);
                  pPVar20 = pPVar16;
                  if (pp_Var13 != (_func_int **)0x0) {
                    pPVar20 = (Pattern *)operator_new(0x18);
                    pPVar20->_vptr_Pattern = (_func_int **)&PTR__Pattern_00113d20;
                    pPVar20[1]._vptr_Pattern = pp_Var13;
                    pPVar20[2]._vptr_Pattern = (_func_int **)pPVar16;
                  }
                  lVar15 = lVar15 + 8;
                  pPVar16 = pPVar20;
                } while (lVar15 != 0x10);
                pPVar19[1]._vptr_Pattern = (_func_int **)pPVar20;
                local_68[0] = pPVar19;
                if (iVar25._M_current == local_98) {
                  std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
                  _M_realloc_insert<AST::Pattern*>
                            ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,iVar25
                             ,local_68);
                  ppTVar29 = local_58;
                }
                else {
                  *iVar25._M_current = pPVar19;
                  iStack_a0._M_current = iStack_a0._M_current + 1;
                  ppTVar29 = local_58;
                }
              }
              goto LAB_0010b40a;
            }
            lVar15 = __dynamic_cast(pTVar12,&Token::typeinfo,&T_GroupClose::typeinfo,0);
            if (lVar15 == 0) goto LAB_0010b6af;
            lVar18 = __dynamic_cast(plVar3,&Token::typeinfo,&T_GroupOpen::typeinfo,0);
            if (lVar18 == 0) {
              __assert_fail("topgo",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x13e,"bool should_eval(Token *, vector<Token *> &)");
            }
            if (*(int *)(lVar18 + 8) != *(int *)(lVar15 + 8)) {
              if (*(int *)(lVar18 + 8) == 0) goto LAB_0010b6af;
              goto LAB_0010b484;
            }
            local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl
                          .super__Vector_impl_data._M_finish[-1].x;
LAB_0010b6af:
            iVar7 = (*local_70->_vptr_Token[3])();
            iVar28._M_current = local_50;
            if ((char)iVar7 != '\0') {
              if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_ac = (uint)CONCAT71((uint7)(uint3)((uint)iVar7 >> 8),1);
                std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                          ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                           (iterator)
                           local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_70);
              }
              else {
                *(Token **)
                 local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_70;
                local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_c8.
                                     super__Vector_base<Direction,_std::allocator<Direction>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 8);
                local_ac = (uint)CONCAT71((int7)((ulong)local_70 >> 8),1);
              }
            }
          }
          else {
            if ((local_ac & 1) == 0) {
              __assert_fail("expectAtom",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x156,"AST::Pattern *parse_tokenized(vector<Token *> &)");
            }
            if (local_70 == (Token *)0x0) {
              lVar15 = 0;
            }
            else {
              lVar15 = __dynamic_cast(local_70,&Token::typeinfo,&T_Pattern::typeinfo,0);
            }
            if (lVar15 == 0) {
              __assert_fail("tp",
                            "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                            ,0x159,"AST::Pattern *parse_tokenized(vector<Token *> &)");
            }
            if (iStack_a0._M_current == local_98) {
              std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::
              _M_realloc_insert<AST::Pattern*const&>
                        ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,iStack_a0,
                         (Pattern **)(lVar15 + 8));
            }
            else {
              *iStack_a0._M_current = *(Pattern **)(lVar15 + 8);
              iStack_a0._M_current = iStack_a0._M_current + 1;
            }
            local_ac = 0;
          }
        }
        else {
          if ((local_ac & 1) == 0) {
            __assert_fail("expectAtom",
                          "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                          ,0x153,"AST::Pattern *parse_tokenized(vector<Token *> &)");
          }
          if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                      ((vector<Token*,std::allocator<Token*>> *)&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *(Token **)
             local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
             super__Vector_impl_data._M_finish = local_70;
            local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((long)local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 8);
          }
        }
      }
      else {
        local_68[0] = (Pattern *)operator_new(0x20);
        uVar10 = *(uint *)&pTVar12[1]._vptr_Token;
        uVar2 = *(uint *)((long)&pTVar12[1]._vptr_Token + 4);
        uVar4 = uVar10;
        uVar5 = uVar2;
        if (uVar2 < uVar10) {
          uVar4 = uVar2;
          uVar5 = uVar10;
        }
        local_68[0]->_vptr_Pattern = (_func_int **)&PTR__Pattern_00113c98;
        *(uint *)&local_68[0][2]._vptr_Pattern = uVar4;
        *(uint *)((long)&local_68[0][2]._vptr_Pattern + 4) = uVar5;
        *(bool *)&local_68[0][3]._vptr_Pattern = uVar2 < uVar10;
        iVar25._M_current = iStack_a0._M_current + -1;
        local_68[0][1]._vptr_Pattern = (_func_int **)iStack_a0._M_current[-1];
        if (iVar25._M_current == local_98) {
          iStack_a0._M_current = iVar25._M_current;
          std::vector<AST::Pattern*,std::allocator<AST::Pattern*>>::_M_realloc_insert<AST::Pattern*>
                    ((vector<AST::Pattern*,std::allocator<AST::Pattern*>> *)&local_a8,iVar25,
                     local_68);
        }
        else {
          *iVar25._M_current = local_68[0];
        }
      }
      ppTVar29 = ppTVar29 + 1;
    } while (ppTVar29 != iVar28._M_current);
  }
  if ((long)iStack_a0._M_current - (long)local_a8 != 8) {
    __assert_fail("pstk.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp"
                  ,0x182,"AST::Pattern *parse_tokenized(vector<Token *> &)");
  }
  if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pPVar16 = iStack_a0._M_current[-1];
    iStack_a0._M_current = iStack_a0._M_current + -1;
    if (local_a8 != (Token *)0x0) {
      operator_delete(local_a8);
    }
    if (local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pPVar21 = compile_top(pPVar16);
    if (local_88 != (Token **)0x0) {
      operator_delete(local_88);
    }
    if (local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pPVar21;
  }
  __assert_fail("opstk.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/parse.cpp",
                0x183,"AST::Pattern *parse_tokenized(vector<Token *> &)");
}

Assistant:

P_Sequence * parse(s_i &prog) {
    auto tokens0 = tokenize(prog);
    auto tokens1 = insert_concatenators(attach_assertion_directions(tokens0));
#ifdef DEBUG_PARSER
    std::cerr << "Preliminary tokens:";
    for (Token* t : tokens0) std::cerr << ' ' << (str)*t;
    std::cerr << "\nModified tokens:";
    for (Token* t : tokens1) std::cerr << ' ' << (str)*t;
    std::cerr << '\n';
#endif
    return compile_top(parse_tokenized(tokens1));
}